

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&> * __thiscall
Catch::ExprLhs<duckdb::ARTKey_const&>::operator==(ExprLhs<const_duckdb::ARTKey_&> *this,ARTKey *rhs)

{
  StringRef op;
  bool comparisonResult;
  ARTKey *in_RSI;
  BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&> *in_RDI;
  ARTKey *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult = compareEqual<duckdb::ARTKey,duckdb::ARTKey>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)in_RSI;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_duckdb::ARTKey_&,_const_duckdb::ARTKey_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }